

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O2

void __thiscall
Script_SetStackData_kUseScriptNum3_Test::~Script_SetStackData_kUseScriptNum3_Test
          (Script_SetStackData_kUseScriptNum3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, SetStackData_kUseScriptNum3) {
  // script作成
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_SIZE);
  builder.AppendOperator(ScriptOperator::OP_TUCK);
  builder.AppendData(0x20);
  builder.AppendData(0x23);
  builder.AppendOperator(ScriptOperator::OP_WITHIN);
  builder.AppendOperator(ScriptOperator::OP_VERIFY);
  Script script = builder.Build();

  // OP_SIZE OP_TUCK 20 23 OP_WITHIN OP_VERIFY
  size_t size = 6;
  EXPECT_EQ(script.IsEmpty(), false);
  EXPECT_EQ(script.GetElementList().size(), size);
  EXPECT_STREQ(script.GetHex().c_str(), "827d01200123a569");
  EXPECT_STREQ(script.ToString().c_str(),
               "OP_SIZE OP_TUCK 32 35 OP_WITHIN OP_VERIFY");
}